

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_a0c4::read_back_tester::operator()(read_back_tester *this,string *s_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  size_type sVar4;
  long *plVar5;
  size_t in_RCX;
  string *filename_;
  input_file f;
  size_type __dnew;
  vector<char,_std::allocator<char>_> s2;
  vector<char,_std::allocator<char>_> s1;
  string filename;
  long *local_160;
  long local_158;
  long local_150 [2];
  output_file local_140;
  long local_118;
  vector<char,_std::allocator<char>_> local_110;
  vector<char,_std::allocator<char>_> local_f8;
  string local_d8;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  assert_equal local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = (this->_tmp)._path._M_dataplus._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + (this->_tmp)._path._M_string_length);
  std::__cxx11::string::append((char *)&local_d8);
  just::file::impl::output_file::output_file(&local_140,&local_d8);
  just::file::impl::output_file::write
            (&local_140,(int)(s_->_M_dataplus)._M_p,(void *)s_->_M_string_length,in_RCX);
  just::file::impl::output_file::~output_file(&local_140);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
             ,"");
  local_78._assert_msg._filename._M_dataplus._M_p = (pointer)&local_78._assert_msg._filename.field_2
  ;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_b8,local_b0 + (long)local_b8);
  local_78._assert_msg._line = 0x25;
  pcVar2 = (s_->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + s_->_M_string_length);
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  just::file::impl::input_file::input_file((input_file *)&local_140,&local_d8);
  sVar4 = just::file::impl::input_file::size((input_file *)&local_140);
  std::vector<char,_std::allocator<char>_>::resize(&local_f8,sVar4);
  just::file::impl::input_file::read_from_file_start((input_file *)&local_140,&local_f8);
  just::file::impl::input_file::~input_file((input_file *)&local_140);
  just::file::impl::input_file::input_file((input_file *)&local_140,&local_d8);
  sVar4 = just::file::impl::input_file::size((input_file *)&local_140);
  std::vector<char,_std::allocator<char>_>::vector(&local_110,sVar4,(allocator_type *)&local_160);
  just::file::impl::input_file::read_from_file_start((input_file *)&local_140,&local_110);
  just::file::impl::input_file::~input_file((input_file *)&local_140);
  just::file::read<std::__cxx11::string>(&local_98,(file *)&local_d8,filename_);
  local_118 = 100;
  local_160 = local_150;
  plVar5 = (long *)std::__cxx11::string::_M_create((ulong *)&local_160,(ulong)&local_118);
  lVar3 = local_118;
  local_150[0] = local_118;
  local_160 = plVar5;
  memcpy(plVar5,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
         ,100);
  local_158 = lVar3;
  *(undefined1 *)((long)plVar5 + lVar3) = 0;
  paVar1 = &local_140._filename.field_2;
  local_140._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_140,local_160,lVar3 + (long)local_160);
  local_140._f._0_4_ = 0x17;
  just::test::assert_equal_container::
  run<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
            ((assert_equal_container *)&local_140,&local_f8,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._filename._M_dataplus._M_p,
                    local_140._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  local_118 = 100;
  local_160 = local_150;
  plVar5 = (long *)std::__cxx11::string::_M_create((ulong *)&local_160,(ulong)&local_118);
  lVar3 = local_118;
  local_150[0] = local_118;
  local_160 = plVar5;
  memcpy(plVar5,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
         ,100);
  local_158 = lVar3;
  *(undefined1 *)((long)plVar5 + lVar3) = 0;
  local_140._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_140,local_160,lVar3 + (long)local_160);
  local_140._f._0_4_ = 0x18;
  just::test::assert_equal_container::
  run<std::vector<char,std::allocator<char>>,std::__cxx11::string>
            ((assert_equal_container *)&local_140,&local_110,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._filename._M_dataplus._M_p,
                    local_140._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  if (local_110.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  just::test::assert_equal::operator()(&local_78,&local_50,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._assert_msg._filename._M_dataplus._M_p != &local_78._assert_msg._filename.field_2)
  {
    operator_delete(local_78._assert_msg._filename._M_dataplus._M_p,
                    local_78._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void operator()(const std::string& s_) const
    {
      const std::string filename = _tmp.path() + "/test.txt";

      just::file::write(filename, s_);
      JUST_ASSERT_EQUAL(s_, load_file(filename));
    }